

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::ShouldStopBefore(Compaction *this,Slice *internal_key)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  InternalKey *this_00;
  size_type sVar4;
  reference ppFVar5;
  int64_t iVar6;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  InternalKeyComparator *icmp;
  VersionSet *vset;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  size_type in_stack_ffffffffffffff90;
  long lVar7;
  InternalKey *in_stack_ffffffffffffff98;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (InternalKey *)(**(long **)(in_RDI + 0x10) + 0x38);
  while( true ) {
    uVar1 = *(ulong *)(in_RDI + 0x108);
    sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    bVar2 = false;
    if (uVar1 < sVar4) {
      in_stack_ffffffffffffff98 = this_00;
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 this_00,in_stack_ffffffffffffff90);
      local_18 = InternalKey::Encode(in_stack_ffffffffffffff98);
      iVar3 = (**(code **)((in_stack_ffffffffffffff98->rep_)._M_dataplus._M_p + 0x10))
                        (in_stack_ffffffffffffff98,in_RSI,&local_18);
      bVar2 = 0 < iVar3;
    }
    if (!bVar2) break;
    if ((*(byte *)(in_RDI + 0x110) & 1) != 0) {
      ppFVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      *(uint64_t *)(in_RDI + 0x118) = (*ppFVar5)->file_size + *(long *)(in_RDI + 0x118);
    }
    *(long *)(in_RDI + 0x108) = *(long *)(in_RDI + 0x108) + 1;
  }
  *(undefined1 *)(in_RDI + 0x110) = 1;
  lVar7 = *(long *)(in_RDI + 0x118);
  iVar6 = MaxGrandParentOverlapBytes
                    ((Options *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (iVar6 < lVar7) {
    *(undefined8 *)(in_RDI + 0x118) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar6 < lVar7;
}

Assistant:

bool Compaction::ShouldStopBefore(const Slice& internal_key) {
  const VersionSet* vset = input_version_->vset_;
  // Scan to find earliest grandparent file that contains key.
  const InternalKeyComparator* icmp = &vset->icmp_;
  while (grandparent_index_ < grandparents_.size() &&
         icmp->Compare(internal_key,
                       grandparents_[grandparent_index_]->largest.Encode()) >
             0) {
    if (seen_key_) {
      overlapped_bytes_ += grandparents_[grandparent_index_]->file_size;
    }
    grandparent_index_++;
  }
  seen_key_ = true;

  if (overlapped_bytes_ > MaxGrandParentOverlapBytes(vset->options_)) {
    // Too much overlap for current output; start new output
    overlapped_bytes_ = 0;
    return true;
  } else {
    return false;
  }
}